

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

SessionID * __thiscall
FIX::Message::getSessionID(SessionID *__return_storage_ptr__,Message *this,string *qualifier)

{
  Header *this_00;
  BeginString *pBVar1;
  SenderCompID *pSVar2;
  TargetCompID *pTVar3;
  
  this_00 = &this->m_header;
  pBVar1 = FieldMap::getField<FIX::BeginString>(&this_00->super_FieldMap);
  pSVar2 = FieldMap::getField<FIX::SenderCompID>(&this_00->super_FieldMap);
  pTVar3 = FieldMap::getField<FIX::TargetCompID>(&this_00->super_FieldMap);
  SessionID::SessionID
            (__return_storage_ptr__,&(pBVar1->super_StringField).super_FieldBase.m_string,
             &(pSVar2->super_StringField).super_FieldBase.m_string,
             &(pTVar3->super_StringField).super_FieldBase.m_string,qualifier);
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(FieldNotFound) {
  return SessionID(
      getHeader().getField<BeginString>(),
      getHeader().getField<SenderCompID>(),
      getHeader().getField<TargetCompID>(),
      qualifier);
}